

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
::Proxy_Function_Callable_Impl(void *param_1)

{
  _func_shared_ptr<unsigned_short> *in_stack_00000018;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd8;
  Proxy_Function_Impl_Base *in_stack_ffffffffffffffe0;
  
  dispatch::detail::build_param_type_list<std::shared_ptr<unsigned_short>>(in_stack_00000018);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_ffffffffffffffd0);
  *(undefined ***)param_1 = &PTR__Proxy_Function_Callable_Impl_005c8910;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }